

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivially_serializable.cpp
# Opt level: O0

void __thiscall handlegraph::TriviallySerializable::serialize(TriviallySerializable *this,int fd)

{
  long *in_RDI;
  anon_class_8_1_3fcf657c *in_stack_ffffffffffffffb8;
  function<void_(const_void_*,_unsigned_long)> *in_stack_ffffffffffffffc0;
  undefined1 local_30 [48];
  
  std::function<void(void_const*,unsigned_long)>::
  function<handlegraph::TriviallySerializable::serialize(int)const::__0,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (**(code **)(*in_RDI + 0x60))(in_RDI,local_30);
  std::function<void_(const_void_*,_unsigned_long)>::~function
            ((function<void_(const_void_*,_unsigned_long)> *)0x23ea22);
  return;
}

Assistant:

void TriviallySerializable::serialize(int fd) const {
    serialize([&](const void* start, size_t length) {
        // Copy each block to the fd
        size_t written = 0;
        while (written != length) {
            // Bang on the write call until it is all written
            auto result = write(fd, (const void*)((const char*) start + written), length - written);
            if (result == -1) {
                // Can't write at all, something broke.
                throw std::runtime_error("Could not write!");
            }
            written += result;
        }
    });
}